

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blackboard.h
# Opt level: O3

TypedData * blackboard_get(Blackboard *b,int id)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  undefined8 uVar4;
  iterator __position;
  _Base_ptr p_Var5;
  
  if (b == (Blackboard *)0x0) {
    return (TypedData *)0x0;
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)b);
  if (iVar2 != 0) {
    uVar4 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock((pthread_mutex_t *)b);
    _Unwind_Resume(uVar4);
  }
  p_Var3 = (b->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(b->values)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node = &p_Var1->_M_header;
    do {
      if (id <= (int)p_Var3[1]._M_color) {
        __position._M_node = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < id];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
       ((int)__position._M_node[1]._M_color <= id)) {
      p_Var5 = __position._M_node[1]._M_parent;
      std::
      _Rb_tree<int,std::pair<int_const,TypedData*>,std::_Select1st<std::pair<int_const,TypedData*>>,std::less<int>,std::allocator<std::pair<int_const,TypedData*>>>
      ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,TypedData*>,std::_Select1st<std::pair<int_const,TypedData*>>,std::less<int>,std::allocator<std::pair<int_const,TypedData*>>>
                          *)&b->values,__position);
      goto LAB_00114de8;
    }
  }
  p_Var5 = (_Base_ptr)0x0;
LAB_00114de8:
  pthread_mutex_unlock((pthread_mutex_t *)b);
  return (TypedData *)p_Var5;
}

Assistant:

TypedData* blackboard_get(Blackboard* b, int id)
{
    if (!b)
        return 0;

    std::lock_guard<std::mutex> lock(b->bb_mutex);
    auto it = b->values.find(id);
    if (it == b->values.end())
        return {};

    auto r = it->second;
    b->values.erase(it);
    return r;
}